

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O1

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f *wo,Point2f *u)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  Vector3f VVar5;
  Tuple3<pbrt::Vector3,_float> local_28;
  undefined1 local_18 [16];
  
  local_28.z = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  local_18 = ZEXT416((uint)local_28.z);
  if (0.0 <= local_28.z) {
    local_28.z = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
    local_28.x = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
    local_28.y = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  }
  else {
    uVar3._0_4_ = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar3._4_4_ = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar4._0_8_ = uVar3 ^ 0x8000000080000000;
    auVar4._8_4_ = 0x80000000;
    auVar4._12_4_ = 0x80000000;
    local_28.z = -local_28.z;
    local_28._0_8_ = vmovlps_avx(auVar4);
  }
  VVar5 = SampleTrowbridgeReitzVisibleArea((Vector3f *)&local_28,this->alpha_x,this->alpha_y,u);
  uVar3 = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vcmpss_avx512f(local_18,ZEXT816(0) << 0x40,1);
  bVar2 = (bool)((byte)uVar1 & 1);
  if (local_18._0_4_ < 0.0) {
    uVar3 = uVar3 ^ 0x8000000080000000;
  }
  VVar5.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar2 * (int)-VVar5.super_Tuple3<pbrt::Vector3,_float>.z +
              (uint)!bVar2 * (int)VVar5.super_Tuple3<pbrt::Vector3,_float>.z);
  VVar5.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  VVar5.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar3 >> 0x20);
  return (Vector3f)VVar5.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(const Vector3f &wo, const Point2f &u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        if (flip)
            wm = -wm;
        return wm;
    }